

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcpy_s.c
# Opt level: O2

errno_t strcpy_s(char *dest,rsize_t dmax,char *src)

{
  char cVar1;
  rsize_t rVar2;
  errno_t error;
  errno_t eVar3;
  char *msg;
  
  if (dest == (char *)0x0) {
    msg = "strcpy_s: dest is null";
  }
  else {
    if (dmax == 0) {
      msg = "strcpy_s: dmax is 0";
      eVar3 = 0x191;
      error = 0x191;
      goto LAB_00110339;
    }
    if (0x1000 < dmax) {
      msg = "strcpy_s: dmax exceeds max";
      eVar3 = 0x193;
      error = 0x193;
      goto LAB_00110339;
    }
    if (src != (char *)0x0) {
      if (dest == src) {
        return 0;
      }
      if (dest < src) {
        for (rVar2 = 0; dmax != rVar2; rVar2 = rVar2 + 1) {
          if (dest + rVar2 == src) goto LAB_001103b5;
          cVar1 = src[rVar2];
          dest[rVar2] = cVar1;
          if (cVar1 == '\0') {
            return 0;
          }
        }
      }
      else {
        for (rVar2 = 0; dmax != rVar2; rVar2 = rVar2 + 1) {
          if (src + rVar2 == dest) goto LAB_001103b5;
          cVar1 = src[rVar2];
          dest[rVar2] = cVar1;
          if (cVar1 == '\0') {
            return 0;
          }
        }
      }
      *dest = '\0';
      msg = "strcpy_s: not enough space for src";
      eVar3 = 0x196;
      error = 0x196;
      goto LAB_00110339;
    }
    *dest = '\0';
    msg = "strcpy_s: src is null";
  }
  eVar3 = 400;
  error = 400;
LAB_00110339:
  invoke_safe_str_constraint_handler(msg,(void *)0x0,error);
  return eVar3;
LAB_001103b5:
  *dest = '\0';
  msg = "strcpy_s: overlapping objects";
  eVar3 = 0x194;
  error = 0x194;
  goto LAB_00110339;
}

Assistant:

errno_t
strcpy_s (char *dest, rsize_t dmax, const char *src)
{
    rsize_t orig_dmax;
    char *orig_dest;
    const char *overlap_bumper;

    if (dest == NULL) {
        invoke_safe_str_constraint_handler("strcpy_s: dest is null",
                   NULL, ESNULLP);
        return RCNEGATE(ESNULLP);
    }

    if (dmax == 0) {
        invoke_safe_str_constraint_handler("strcpy_s: dmax is 0",
                   NULL, ESZEROL);
        return RCNEGATE(ESZEROL);
    }

    if (dmax > RSIZE_MAX_STR) {
        invoke_safe_str_constraint_handler("strcpy_s: dmax exceeds max",
                   NULL, ESLEMAX);
        return RCNEGATE(ESLEMAX);
    }

    if (src == NULL) {
#ifdef SAFECLIB_STR_NULL_SLACK
        /* null string to clear data */
        while (dmax) {  *dest = '\0'; dmax--; dest++; }
#else
        *dest = '\0';
#endif
        invoke_safe_str_constraint_handler("strcpy_s: src is null",
                   NULL, ESNULLP);
        return RCNEGATE(ESNULLP);
    }

    if (dest == src) {
        return RCNEGATE(EOK);
    }

    /* hold base of dest in case src was not copied */
    orig_dmax = dmax;
    orig_dest = dest;

    if (dest < src) {
        overlap_bumper = src;

        while (dmax > 0) {
            if (dest == overlap_bumper) {
                handle_error(orig_dest, orig_dmax, "strcpy_s: "
                             "overlapping objects",
                             ESOVRLP);
                return RCNEGATE(ESOVRLP);
            }

            *dest = *src;
            if (*dest == '\0') {
#ifdef SAFECLIB_STR_NULL_SLACK
                /* null slack to clear any data */
                while (dmax) { *dest = '\0'; dmax--; dest++; }
#endif
                return RCNEGATE(EOK);
            }

            dmax--;
            dest++;
            src++;
        }

    } else {
        overlap_bumper = dest;

        while (dmax > 0) {
            if (src == overlap_bumper) {
                handle_error(orig_dest, orig_dmax, "strcpy_s: "
                      "overlapping objects",
                      ESOVRLP);
                return RCNEGATE(ESOVRLP);
            }

            *dest = *src;
            if (*dest == '\0') {
#ifdef SAFECLIB_STR_NULL_SLACK
                /* null slack to clear any data */
                while (dmax) { *dest = '\0'; dmax--; dest++; }
#endif
                return RCNEGATE(EOK);
            }

            dmax--;
            dest++;
            src++;
        }
    }

    /*
     * the entire src must have been copied, if not reset dest
     * to null the string.
     */
    handle_error(orig_dest, orig_dmax, "strcpy_s: not "
                 "enough space for src",
                 ESNOSPC);
    return RCNEGATE(ESNOSPC);
}